

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  PrimRefMB *pPVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  uint uVar14;
  float fVar16;
  ulong uVar17;
  float fVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox3fa box;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  unsigned_long local_1e8;
  size_t local_1e0;
  BBox1f *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  PrimInfoMB *local_f0;
  mvector<PrimRefMB> *local_e8;
  range<unsigned_long> *local_e0;
  void *local_d8;
  float fStack_d0;
  uint uStack_cc;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  void *local_70;
  float local_68;
  int local_64;
  void **local_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  ulong uVar15;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar19 = r->_begin;
  local_f0 = __return_storage_ptr__;
  if (uVar19 < r->_end) {
    local_158 = SUB6416(ZEXT464(0x3f800000),0);
    local_168 = ZEXT816(0x3f80000000000000);
    local_48.m128[2] = -INFINITY;
    local_48._0_8_ = 0xff800000ff800000;
    local_48.m128[3] = -INFINITY;
    local_58.m128[2] = INFINITY;
    local_58._0_8_ = 0x7f8000007f800000;
    local_58.m128[3] = INFINITY;
    local_1e8 = 0;
    auVar25 = ZEXT816(0) << 0x40;
    local_1e0 = 0;
    uVar17 = 0;
    local_1d8 = t0t1;
    local_1a8 = local_48;
    local_198 = local_58;
    local_188 = local_58;
    local_178 = local_48;
    local_e8 = prims;
    local_e0 = r;
    do {
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = BVar2.lower;
      auVar24._4_4_ = BVar2.upper;
      auVar32 = vmovshdup_avx(auVar24);
      fVar1 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar16 = local_1d8->lower;
      fVar28 = local_1d8->upper;
      fVar23 = BVar2.lower;
      fVar18 = auVar32._0_4_ - fVar23;
      auVar32 = ZEXT416((uint)(fVar1 * ((fVar16 - fVar23) / fVar18) * 1.0000002));
      auVar32 = vroundss_avx(auVar32,auVar32,9);
      auVar32 = vmaxss_avx(auVar25,auVar32);
      auVar30 = ZEXT416((uint)(fVar1 * ((fVar28 - fVar23) / fVar18) * 0.99999976));
      auVar30 = vroundss_avx(auVar30,auVar30,10);
      auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
      fVar18 = (float)uVar19;
      if ((uint)(int)auVar32._0_4_ <= (uint)(int)auVar30._0_4_) {
        uVar21 = (ulong)(int)auVar32._0_4_;
        do {
          local_218 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          fStack_20c = (float)uVar21;
          local_208 = &local_118;
          fStack_210 = fVar18;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_218);
          auVar9._4_4_ = fStack_114;
          auVar9._0_4_ = local_118;
          auVar9._8_4_ = fStack_110;
          auVar9._12_4_ = fStack_10c;
          auVar10._4_4_ = fStack_104;
          auVar10._0_4_ = local_108;
          auVar10._8_4_ = fStack_100;
          auVar10._12_4_ = fStack_fc;
          auVar25._8_4_ = 0xddccb9a2;
          auVar25._0_8_ = 0xddccb9a2ddccb9a2;
          auVar25._12_4_ = 0xddccb9a2;
          auVar25 = vcmpps_avx(auVar9,auVar25,6);
          auVar32._8_4_ = 0x5dccb9a2;
          auVar32._0_8_ = 0x5dccb9a25dccb9a2;
          auVar32._12_4_ = 0x5dccb9a2;
          auVar32 = vcmpps_avx(auVar10,auVar32,1);
          auVar25 = vandps_avx(auVar32,auVar25);
          auVar32 = vcmpps_avx(auVar9,auVar10,2);
          auVar25 = vandps_avx(auVar25,auVar32);
          uVar13 = vmovmskps_avx(auVar25);
          if ((~(byte)uVar13 & 7) != 0) {
            auVar25 = ZEXT816(0);
            goto LAB_011f5a71;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 <= (ulong)(long)(int)auVar30._0_4_);
        fVar1 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
        fVar16 = local_1d8->lower;
        fVar28 = local_1d8->upper;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
        auVar24._4_4_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper;
        auVar25 = SUB6416(ZEXT864(0),0);
      }
      fVar22 = auVar24._0_4_;
      auVar32 = vmovshdup_avx(auVar24);
      fVar23 = auVar32._0_4_ - fVar22;
      fVar29 = (fVar16 - fVar22) / fVar23;
      fVar23 = (fVar28 - fVar22) / fVar23;
      fVar16 = fVar1 * fVar29;
      local_1f8._0_4_ = fVar16;
      fVar28 = fVar1 * fVar23;
      auVar30 = vroundss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),9);
      local_1b8._0_4_ = fVar28;
      auVar24 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),10);
      auVar25 = vmaxss_avx(auVar30,auVar25);
      local_128._0_4_ = auVar25._0_4_;
      auVar32 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
      fStack_20c = (float)(int)auVar25._0_4_;
      uVar21 = (ulong)(uint)fStack_20c;
      local_1c8._0_4_ = auVar32._0_4_;
      fVar16 = (float)(int)auVar32._0_4_;
      iVar20 = (int)auVar30._0_4_;
      if ((int)auVar30._0_4_ < 0) {
        iVar20 = -1;
      }
      iVar8 = (int)fVar1 + 1;
      if ((int)auVar24._0_4_ < (int)fVar1 + 1) {
        iVar8 = (int)auVar24._0_4_;
      }
      local_218 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_148._0_4_ = fStack_20c;
      local_208 = &local_118;
      fStack_210 = fVar18;
      local_1d0 = uVar17;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_218);
      local_98 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_138._0_4_ = fVar16;
      fStack_90 = fVar18;
      fStack_8c = fVar16;
      local_88 = &local_218;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_98);
      if (iVar8 - iVar20 == 1) {
        auVar25 = ZEXT816(0) << 0x40;
        auVar32 = vmaxss_avx(ZEXT416((uint)((float)local_1f8._0_4_ - (float)local_128._0_4_)),
                             auVar25);
        auVar30 = vshufps_avx(auVar32,auVar32,0);
        auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar35._0_4_ = auVar30._0_4_ * (float)local_218 + auVar32._0_4_ * local_118;
        auVar35._4_4_ = auVar30._4_4_ * local_218._4_4_ + auVar32._4_4_ * fStack_114;
        auVar35._8_4_ = auVar30._8_4_ * fStack_210 + auVar32._8_4_ * fStack_110;
        auVar35._12_4_ = auVar30._12_4_ * fStack_20c + auVar32._12_4_ * fStack_10c;
        auVar34._0_4_ = auVar30._0_4_ * (float)local_208 + auVar32._0_4_ * local_108;
        auVar34._4_4_ = auVar30._4_4_ * local_208._4_4_ + auVar32._4_4_ * fStack_104;
        auVar34._8_4_ = auVar30._8_4_ * fStack_200 + auVar32._8_4_ * fStack_100;
        auVar34._12_4_ = auVar30._12_4_ * fStack_1fc + auVar32._12_4_ * fStack_fc;
        auVar32 = vmaxss_avx(ZEXT416((uint)((float)local_1c8._0_4_ - (float)local_1b8._0_4_)),
                             auVar25);
        auVar24 = vshufps_avx(auVar32,auVar32,0);
        auVar32 = ZEXT416((uint)(1.0 - auVar32._0_4_));
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar30._0_4_ = auVar32._0_4_ * (float)local_218 + auVar24._0_4_ * local_118;
        auVar30._4_4_ = auVar32._4_4_ * local_218._4_4_ + auVar24._4_4_ * fStack_114;
        auVar30._8_4_ = auVar32._8_4_ * fStack_210 + auVar24._8_4_ * fStack_110;
        auVar30._12_4_ = auVar32._12_4_ * fStack_20c + auVar24._12_4_ * fStack_10c;
        auVar33._0_4_ = auVar32._0_4_ * (float)local_208 + auVar24._0_4_ * local_108;
        auVar33._4_4_ = auVar32._4_4_ * local_208._4_4_ + auVar24._4_4_ * fStack_104;
        auVar33._8_4_ = auVar32._8_4_ * fStack_200 + auVar24._8_4_ * fStack_100;
        auVar33._12_4_ = auVar32._12_4_ * fStack_1fc + auVar24._12_4_ * fStack_fc;
      }
      else {
        fStack_ac = (float)(local_148._0_4_ + 1);
        local_b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_1f8._0_4_ = (float)local_1f8._0_4_ - (float)local_128._0_4_;
        fStack_b0 = fVar18;
        local_a8 = &local_98;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_b8)
        ;
        uStack_cc = local_138._0_4_ - 1;
        uVar21 = (ulong)uStack_cc;
        local_d8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_d0 = fVar18;
        local_c8 = &local_b8;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_d8)
        ;
        auVar25 = vmaxss_avx(ZEXT416((uint)local_1f8._0_4_),ZEXT816(0) << 0x40);
        auVar32 = vshufps_avx(auVar25,auVar25,0);
        auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
        auVar25 = vshufps_avx(auVar25,auVar25,0);
        auVar35._0_4_ = auVar32._0_4_ * (float)local_98 + auVar25._0_4_ * local_118;
        auVar35._4_4_ = auVar32._4_4_ * local_98._4_4_ + auVar25._4_4_ * fStack_114;
        auVar35._8_4_ = auVar32._8_4_ * fStack_90 + auVar25._8_4_ * fStack_110;
        auVar35._12_4_ = auVar32._12_4_ * fStack_8c + auVar25._12_4_ * fStack_10c;
        auVar34._0_4_ = auVar32._0_4_ * (float)local_88 + auVar25._0_4_ * local_108;
        auVar34._4_4_ = auVar32._4_4_ * local_88._4_4_ + auVar25._4_4_ * fStack_104;
        auVar34._8_4_ = auVar32._8_4_ * fStack_80 + auVar25._8_4_ * fStack_100;
        auVar34._12_4_ = auVar32._12_4_ * fStack_7c + auVar25._12_4_ * fStack_fc;
        auVar25 = vmaxss_avx(ZEXT416((uint)((float)local_1c8._0_4_ - (float)local_1b8._0_4_)),
                             ZEXT816(0) << 0x40);
        auVar32 = vshufps_avx(auVar25,auVar25,0);
        auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
        auVar25 = vshufps_avx(auVar25,auVar25,0);
        auVar30._0_4_ = auVar32._0_4_ * (float)local_b8 + auVar25._0_4_ * (float)local_218;
        auVar30._4_4_ = auVar32._4_4_ * local_b8._4_4_ + auVar25._4_4_ * local_218._4_4_;
        auVar30._8_4_ = auVar32._8_4_ * fStack_b0 + auVar25._8_4_ * fStack_210;
        auVar30._12_4_ = auVar32._12_4_ * fStack_ac + auVar25._12_4_ * fStack_20c;
        auVar33._0_4_ = auVar32._0_4_ * (float)local_a8 + auVar25._0_4_ * (float)local_208;
        auVar33._4_4_ = auVar32._4_4_ * local_a8._4_4_ + auVar25._4_4_ * local_208._4_4_;
        auVar33._8_4_ = auVar32._8_4_ * fStack_a0 + auVar25._8_4_ * fStack_200;
        auVar33._12_4_ = auVar32._12_4_ * fStack_9c + auVar25._12_4_ * fStack_1fc;
        iVar20 = iVar20 + 1;
        if (iVar20 < iVar8) {
          do {
            auVar26._0_4_ = ((float)iVar20 / fVar1 - fVar29) / (fVar23 - fVar29);
            auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar25 = vshufps_avx(auVar26,auVar26,0);
            auVar32 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
            local_138._0_4_ = auVar30._0_4_ * auVar25._0_4_ + auVar35._0_4_ * auVar32._0_4_;
            local_138._4_4_ = auVar30._4_4_ * auVar25._4_4_ + auVar35._4_4_ * auVar32._4_4_;
            local_138._8_4_ = auVar30._8_4_ * auVar25._8_4_ + auVar35._8_4_ * auVar32._8_4_;
            local_138._12_4_ = auVar30._12_4_ * auVar25._12_4_ + auVar35._12_4_ * auVar32._12_4_;
            local_148._0_4_ = auVar33._0_4_ * auVar25._0_4_ + auVar34._0_4_ * auVar32._0_4_;
            local_148._4_4_ = auVar33._4_4_ * auVar25._4_4_ + auVar34._4_4_ * auVar32._4_4_;
            local_148._8_4_ = auVar33._8_4_ * auVar25._8_4_ + auVar34._8_4_ * auVar32._8_4_;
            local_148._12_4_ = auVar33._12_4_ * auVar25._12_4_ + auVar34._12_4_ * auVar32._12_4_;
            local_70 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            _local_1f8 = auVar30;
            _local_1c8 = auVar35;
            _local_1b8 = auVar34;
            _local_128 = auVar33;
            local_68 = fVar18;
            local_64 = iVar20;
            local_60 = &local_d8;
            (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                      (&local_70);
            auVar11._8_4_ = fStack_d0;
            auVar11._0_8_ = local_d8;
            auVar11._12_4_ = uStack_cc;
            auVar25 = vsubps_avx(auVar11,local_138);
            auVar12._8_8_ = uStack_c0;
            auVar12._0_8_ = local_c8;
            auVar30 = vsubps_avx(auVar12,local_148);
            auVar32 = vminps_avx(auVar25,ZEXT816(0) << 0x40);
            auVar25 = vmaxps_avx(auVar30,ZEXT816(0) << 0x40);
            auVar35._0_4_ = (float)local_1c8._0_4_ + auVar32._0_4_;
            auVar35._4_4_ = (float)local_1c8._4_4_ + auVar32._4_4_;
            auVar35._8_4_ = fStack_1c0 + auVar32._8_4_;
            auVar35._12_4_ = fStack_1bc + auVar32._12_4_;
            auVar30._0_4_ = (float)local_1f8._0_4_ + auVar32._0_4_;
            auVar30._4_4_ = (float)local_1f8._4_4_ + auVar32._4_4_;
            auVar30._8_4_ = fStack_1f0 + auVar32._8_4_;
            auVar30._12_4_ = fStack_1ec + auVar32._12_4_;
            auVar34._0_4_ = (float)local_1b8._0_4_ + auVar25._0_4_;
            auVar34._4_4_ = (float)local_1b8._4_4_ + auVar25._4_4_;
            auVar34._8_4_ = fStack_1b0 + auVar25._8_4_;
            auVar34._12_4_ = fStack_1ac + auVar25._12_4_;
            auVar33._0_4_ = (float)local_128._0_4_ + auVar25._0_4_;
            auVar33._4_4_ = (float)local_128._4_4_ + auVar25._4_4_;
            auVar33._8_4_ = fStack_120 + auVar25._8_4_;
            auVar33._12_4_ = fStack_11c + auVar25._12_4_;
            iVar20 = iVar20 + 1;
          } while (iVar8 != iVar20);
        }
        auVar25 = ZEXT816(0) << 0x40;
      }
      aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar35,ZEXT416(geomID),0x30);
      uVar14 = (this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1;
      uVar15 = (ulong)uVar14;
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      auVar27._8_8_ = 0;
      auVar27._0_4_ = BVar2.lower;
      auVar27._4_4_ = BVar2.upper;
      aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar34,ZEXT416((uint)fVar18),0x30);
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar30,ZEXT416(uVar14),0x30);
      aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar33,ZEXT416(uVar14),0x30);
      auVar30 = vcmpps_avx(local_158,auVar27,1);
      auVar24 = vinsertps_avx(local_158,auVar27,0x50);
      auVar32 = vblendps_avx(auVar27,local_158,2);
      local_158 = vblendvps_avx(auVar32,auVar24,auVar30);
      auVar31._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
      auVar31._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
      auVar31._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
      auVar31._12_4_ =
           aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
      local_198.m128 = (__m128)vminps_avx(local_198.m128,auVar31);
      local_1a8.m128 = (__m128)vmaxps_avx(local_1a8.m128,auVar31);
      local_1e8 = local_1e8 + 1;
      local_1e0 = local_1e0 + uVar15;
      auVar32 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar21 >> 8),local_1d0 < uVar15)),0x50);
      auVar32 = vpslld_avx(auVar32,0x1f);
      local_168 = vblendvps_avx(local_168,auVar27,auVar32);
      local_188.m128 = (__m128)vminps_avx(local_188.m128,(undefined1  [16])aVar4);
      uVar17 = local_1d0;
      if (local_1d0 <= uVar15) {
        uVar17 = uVar15;
      }
      pPVar3 = local_e8->items;
      pPVar3[k].lbounds.bounds0.lower.field_0.field_1 = aVar4;
      local_178.m128 = (__m128)vmaxps_avx(local_178.m128,(undefined1  [16])aVar5);
      pPVar3[k].lbounds.bounds0.upper.field_0.field_1 = aVar5;
      local_58.m128 = (__m128)vminps_avx(local_58.m128,(undefined1  [16])aVar6);
      pPVar3[k].lbounds.bounds1.lower.field_0.field_1 = aVar6;
      local_48.m128 = (__m128)vmaxps_avx(local_48.m128,(undefined1  [16])aVar7);
      pPVar3[k].lbounds.bounds1.upper.field_0.field_1 = aVar7;
      pPVar3[k].time_range = BVar2;
      k = k + 1;
LAB_011f5a71:
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_e0->_end);
    (local_f0->object_range)._end = local_1e8;
  }
  else {
    local_158 = SUB6416(ZEXT464(0x3f800000),0);
    local_168 = ZEXT816(0x3f80000000000000);
    local_188.m128[2] = INFINITY;
    local_188._0_8_ = 0x7f8000007f800000;
    local_188.m128[3] = INFINITY;
    local_178.m128[2] = -INFINITY;
    local_178._0_8_ = 0xff800000ff800000;
    local_178.m128[3] = -INFINITY;
    uVar17 = 0;
    local_1e0 = 0;
    local_198 = local_188;
    local_1a8 = local_178;
    local_58 = local_188;
    local_48 = local_178;
  }
  auVar25 = vmovlhps_avx(local_168,local_158);
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 =
       local_188;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 =
       local_178;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 =
       local_58;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 =
       local_48;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0 = local_198;
  (local_f0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0 = local_1a8;
  local_f0->num_time_segments = local_1e0;
  local_f0->max_num_time_segments = uVar17;
  (local_f0->max_time_range).lower = (float)(int)auVar25._0_8_;
  (local_f0->max_time_range).upper = (float)(int)((ulong)auVar25._0_8_ >> 0x20);
  (local_f0->time_range).lower = (float)(int)auVar25._8_8_;
  (local_f0->time_range).upper = (float)(int)((ulong)auVar25._8_8_ >> 0x20);
  return local_f0;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }